

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_scriptedmarine.cpp
# Opt level: O0

int AF_A_M_FirePlasma(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *self_00;
  DObject *this;
  AActor *dest;
  PClassActor *type;
  bool bVar1;
  bool local_56;
  bool local_53;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                  ,0x22f,"int AF_A_M_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    self_00 = (AActor *)(param->field_0).field_1.a;
    local_53 = true;
    if (self_00 != (AActor *)0x0) {
      local_53 = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_53 != false) {
      if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
        bVar1 = false;
        if ((param[1].field_0.field_3.Type == '\x03') &&
           (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
          bVar1 = param[1].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar1) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                        ,0x22f,
                        "int AF_A_M_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        this = (DObject *)param[1].field_0.field_1.a;
        local_56 = true;
        if (this != (DObject *)0x0) {
          local_56 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
        }
        if (local_56 == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                        ,0x22f,
                        "int AF_A_M_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
        bVar1 = false;
        if ((param[2].field_0.field_3.Type == '\x03') &&
           (bVar1 = true, param[2].field_0.field_1.atag != 8)) {
          bVar1 = param[2].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar1) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                        ,0x22f,
                        "int AF_A_M_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      bVar1 = TObjPtr<AActor>::operator==(&self_00->target,(AActor *)0x0);
      if (!bVar1) {
        A_FaceTarget(self_00);
        dest = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&self_00->target);
        type = PClass::FindActor("PlasmaBall");
        P_SpawnMissile(self_00,dest,type,(AActor *)0x0);
        self_00->special1 = level.maptime + 0x14;
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                  ,0x22f,"int AF_A_M_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                ,0x22f,"int AF_A_M_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_M_FirePlasma)
{
	PARAM_ACTION_PROLOGUE;

	if (self->target == NULL)
		return 0;

	A_FaceTarget (self);
	P_SpawnMissile (self, self->target, PClass::FindActor("PlasmaBall"));
	self->special1 = level.maptime + 20;
	return 0;
}